

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O1

void shm::gen_key(shm_key_t *key,int proj_id)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  undefined4 in_register_00000034;
  shm_key_t val_key;
  char local_38 [32];
  
  if (gen_key(char&[],int)::rd == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::rd,CONCAT44(in_register_00000034,proj_id));
    if (iVar2 != 0) {
      std::random_device::random_device(&gen_key::rd);
      __cxa_atexit(std::random_device::~random_device,&gen_key::rd,&__dso_handle);
      __cxa_guard_release(&gen_key(char&[],int)::rd);
    }
  }
  if (gen_key(char&[],int)::gen == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::gen);
    if (iVar2 != 0) {
      uVar1 = std::random_device::_M_getval();
      uVar3 = (ulong)uVar1;
      lVar4 = 1;
      gen_key::gen._M_x[0] = uVar3;
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
        gen_key::gen._M_x[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      gen_key::gen._M_p = 0x270;
      __cxa_guard_release(&gen_key(char&[],int)::gen);
    }
  }
  if (gen_key(char&[],int)::distrib == '\0') {
    gen_key();
  }
  uVar1 = std::uniform_int_distribution<int>::operator()
                    (&gen_key::distrib,&gen_key::gen,&gen_key::distrib._M_param);
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  snprintf(local_38,0x18,"%d",(ulong)uVar1);
  *(char *)((long)key + 0) = '\0';
  *(char *)((long)key + 1) = '\0';
  *(char *)((long)key + 2) = '\0';
  *(char *)((long)key + 3) = '\0';
  *(char *)((long)key + 4) = '\0';
  *(char *)((long)key + 5) = '\0';
  *(char *)((long)key + 6) = '\0';
  *(char *)((long)key + 7) = '\0';
  *(char *)((long)key + 8) = '\0';
  *(char *)((long)key + 9) = '\0';
  *(char *)((long)key + 10) = '\0';
  *(char *)((long)key + 0xb) = '\0';
  *(char *)((long)key + 0xc) = '\0';
  *(char *)((long)key + 0xd) = '\0';
  *(char *)((long)key + 0xe) = '\0';
  *(char *)((long)key + 0xf) = '\0';
  *(char *)((long)key + 0x10) = '\0';
  *(char *)((long)key + 0x11) = '\0';
  *(char *)((long)key + 0x12) = '\0';
  *(char *)((long)key + 0x13) = '\0';
  *(char *)((long)key + 0x14) = '\0';
  *(char *)((long)key + 0x15) = '\0';
  *(char *)((long)key + 0x16) = '\0';
  *(char *)((long)key + 0x17) = '\0';
  strncpy(*key,local_38,0x18);
  return;
}

Assistant:

void 
shm::gen_key( shm_key_t &key, const int proj_id )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    UNUSED( proj_id );
    static std::random_device rd;
    static std::mt19937 gen( rd() );
    static std::uniform_int_distribution<> distrib( 0, std::numeric_limits< int >::max() );
    const auto val = distrib( gen );
    shm_key_t val_key;
    std::memset(    val_key, 
                    '\0', 
                    shm_key_length );

    std::snprintf( val_key, 
                   shm_key_length,
                   "%d",
                   val );

    shm::key_copy( key, val_key );
    return;
#elif _USE_SYSTEMV_SHM_ == 1
    //integer key
    char *path = getcwd( nullptr, 0 );
    if( path == nullptr )
    {
        std::perror( "failed to get cwd, switching to guns, a.k.a. root dir (/)" );
        key = ftok( "/", proj_id);
    }
    else
    {
        key = ftok( path, proj_id);
    }
    return;
#endif
}